

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

uint8_t * WebPIDecGetYUVA(WebPIDecoder *idec,int *last_y,uint8_t **u,uint8_t **v,uint8_t **a,
                         int *width,int *height,int *stride,int *uv_stride,int *a_stride)

{
  WebPDecBuffer *pWVar1;
  
  if ((((idec == (WebPIDecoder *)0x0) || (idec->dec_ == (void *)0x0)) ||
      (idec->state_ < STATE_VP8_DATA)) || (idec->final_output_ != (WebPDecBuffer *)0x0)) {
    pWVar1 = (WebPDecBuffer *)0x0;
  }
  else {
    pWVar1 = (idec->params_).output;
  }
  if ((pWVar1 != (WebPDecBuffer *)0x0) && (MODE_rgbA_4444 < pWVar1->colorspace)) {
    if (last_y != (int *)0x0) {
      *last_y = (idec->params_).last_y;
    }
    if (u != (uint8_t **)0x0) {
      *u = (pWVar1->u).YUVA.u;
    }
    if (v != (uint8_t **)0x0) {
      *v = (uint8_t *)(pWVar1->u).RGBA.size;
    }
    if (a != (uint8_t **)0x0) {
      *a = (pWVar1->u).YUVA.a;
    }
    if (width != (int *)0x0) {
      *width = pWVar1->width;
    }
    if (height != (int *)0x0) {
      *height = pWVar1->height;
    }
    if (stride != (int *)0x0) {
      *stride = (pWVar1->u).YUVA.y_stride;
    }
    if (uv_stride != (int *)0x0) {
      *uv_stride = (pWVar1->u).YUVA.u_stride;
    }
    if (a_stride != (int *)0x0) {
      *a_stride = (pWVar1->u).YUVA.a_stride;
    }
    return (pWVar1->u).RGBA.rgba;
  }
  return (uint8_t *)0x0;
}

Assistant:

WEBP_NODISCARD uint8_t* WebPIDecGetYUVA(const WebPIDecoder* idec, int* last_y,
                                        uint8_t** u, uint8_t** v, uint8_t** a,
                                        int* width, int* height, int* stride,
                                        int* uv_stride, int* a_stride) {
  const WebPDecBuffer* const src = GetOutputBuffer(idec);
  if (src == NULL) return NULL;
  if (src->colorspace < MODE_YUV) {
    return NULL;
  }

  if (last_y != NULL) *last_y = idec->params_.last_y;
  if (u != NULL) *u = src->u.YUVA.u;
  if (v != NULL) *v = src->u.YUVA.v;
  if (a != NULL) *a = src->u.YUVA.a;
  if (width != NULL) *width = src->width;
  if (height != NULL) *height = src->height;
  if (stride != NULL) *stride = src->u.YUVA.y_stride;
  if (uv_stride != NULL) *uv_stride = src->u.YUVA.u_stride;
  if (a_stride != NULL) *a_stride = src->u.YUVA.a_stride;

  return src->u.YUVA.y;
}